

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirSAVETAP(void)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  aint param3;
  int iVar5;
  aint start;
  char *pcVar6;
  char *pcVar7;
  uchar flag;
  aint val;
  int local_a8;
  EStatus local_a4;
  char *id;
  string fnaamh;
  path fnaam;
  string local_50;
  
  pcVar1 = DeviceID;
  if (pass != 3) {
    SkipParam(&lp);
    return;
  }
  if (DeviceID == (char *)0x0) {
    Error("SAVETAP only allowed in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
  }
  GetOutputFileName_abi_cxx11_(&fnaam,&lp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fnaamh,"",(allocator<char> *)&local_50);
  bVar2 = anyComma(&lp);
  if (bVar2) {
    bVar2 = anyComma(&lp);
    pcVar7 = lp;
    if (bVar2) {
LAB_0010d7c8:
      Error("[SAVETAP] Syntax error. No parameters",bp,PASS3);
      goto LAB_0010db5a;
    }
    id = GetID(&lp);
    local_a4 = PASS3;
    flag = 0xff;
    if ((id == (char *)0x0) || (*id == '\0')) {
LAB_0010dad4:
      IsLabelNotFound = false;
      lp = pcVar7;
      iVar4 = ParseExpression(&lp,&val);
      pcVar7 = "[SAVETAP] Syntax error";
      if ((iVar4 != 0) && (IsLabelNotFound == false)) {
        if (-1 < val) {
          param3 = -1;
          bVar2 = false;
          start = val;
          iVar4 = param3;
          iVar5 = param3;
          goto LAB_0010db10;
        }
        pcVar7 = "[SAVETAP] Negative values are not allowed";
      }
    }
    else {
      iVar4 = cmphstr(&id,"basic",false);
      flag = '\0';
      bVar2 = false;
      if (iVar4 == 0) {
        iVar4 = cmphstr(&id,"numbers",false);
        if (iVar4 == 0) {
          iVar4 = cmphstr(&id,"chars",false);
          if (iVar4 == 0) {
            iVar4 = cmphstr(&id,"code",false);
            if (iVar4 == 0) {
              iVar4 = cmphstr(&id,"headless",false);
              bVar2 = true;
              flag = 0xff;
              if (iVar4 == 0) goto LAB_0010dad4;
              goto LAB_0010d85c;
            }
            flag = '\x03';
          }
          else {
            flag = '\x02';
          }
        }
        else {
          flag = '\x01';
        }
        bVar2 = false;
      }
LAB_0010d85c:
      bVar3 = anyComma(&lp);
      if (!bVar3) goto LAB_0010dad4;
      if (bVar2) {
        bVar2 = anyComma(&lp);
        if (bVar2) {
          pcVar7 = "[SAVETAP] Syntax error. Missing start address";
          goto LAB_0010db44;
        }
        iVar4 = ParseExpression(&lp,&val);
        start = val;
        pcVar6 = "[SAVETAP] Syntax error";
        pcVar7 = pcVar6;
        if ((iVar4 == 0) || (pcVar7 = "[SAVETAP] Negative values are not allowed", val < 0))
        goto LAB_0010db44;
        if (0xffff < (uint)val) {
LAB_0010d8f2:
          pcVar7 = "[SAVETAP] Values higher than FFFFh are not allowed";
          goto LAB_0010db44;
        }
        bVar2 = anyComma(&lp);
        if (bVar2) {
          iVar4 = ParseExpression(&lp,&val);
          pcVar7 = pcVar6;
          if ((iVar4 == 0) || (pcVar7 = "[SAVETAP] Negative values are not allowed", val < 0))
          goto LAB_0010db44;
          iVar4 = val;
          if (0xffff < (uint)val) goto LAB_0010daa0;
        }
        else {
          iVar4 = -1;
        }
        bVar2 = anyComma(&lp);
        iVar5 = -1;
        if (bVar2) {
          iVar5 = ParseExpression(&lp,&val);
          pcVar7 = pcVar6;
          if (iVar5 != 0) {
            bVar2 = true;
            param3 = val;
            iVar5 = -1;
            if ((uint)val < 0x100) goto LAB_0010db10;
            pcVar7 = "[SAVETAP] Invalid flag byte";
          }
          goto LAB_0010db44;
        }
LAB_0010dbd0:
        bVar2 = true;
        param3 = -1;
LAB_0010db10:
        if (pcVar1 == (char *)0x0) goto LAB_0010db5a;
        if (!bVar2) goto LAB_0010d7a4;
        iVar4 = TAP_SaveBlock(&fnaam,flag,fnaamh._M_dataplus._M_p,start,iVar4,iVar5,param3);
        goto LAB_0010d7be;
      }
      bVar2 = anyComma(&lp);
      if (bVar2) {
        pcVar7 = "[SAVETAP] Syntax error. Missing tape block file name";
      }
      else {
        GetDelimitedString_abi_cxx11_(&local_50,&lp);
        std::__cxx11::string::operator=((string *)&fnaamh,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (fnaamh._M_string_length == 0) {
          pcVar7 = "[SAVETAP] Syntax error in tape file name";
        }
        else {
          bVar2 = anyComma(&lp);
          pcVar7 = "[SAVETAP] Syntax error. Missing start address";
          if ((((bVar2) && (bVar2 = anyComma(&lp), !bVar2)) &&
              (iVar4 = ParseExpression(&lp,&val), start = val, iVar4 != 0)) &&
             (pcVar6 = "[SAVETAP] Negative values are not allowed", pcVar7 = pcVar6, -1 < val)) {
            if (0xffff < (uint)val) goto LAB_0010d8f2;
            bVar2 = anyComma(&lp);
            pcVar7 = "[SAVETAP] Syntax error. Missing block length";
            if (((bVar2) && (bVar2 = anyComma(&lp), !bVar2)) &&
               ((iVar5 = ParseExpression(&lp,&val), iVar4 = val, iVar5 != 0 &&
                (pcVar7 = pcVar6, -1 < val)))) {
              if ((uint)val < 0x10000) {
                bVar2 = anyComma(&lp);
                if (!bVar2) {
                  local_a8 = -1;
LAB_0010dbde:
                  bVar2 = anyComma(&lp);
                  iVar5 = local_a8;
                  if (bVar2) {
                    iVar5 = ParseExpression(&lp,&val);
                    if (iVar5 == 0) goto LAB_0010dc2d;
                    if (val < 0) goto LAB_0010db44;
                    bVar2 = true;
                    param3 = val;
                    iVar5 = local_a8;
                    if (0xffff < (uint)val) goto LAB_0010dc21;
                    goto LAB_0010db10;
                  }
                  goto LAB_0010dbd0;
                }
                iVar5 = ParseExpression(&lp,&val);
                if (iVar5 == 0) {
LAB_0010dc2d:
                  local_a4 = IF_FIRST;
                  pcVar7 = "[SAVETAP] Syntax error";
                }
                else {
                  local_a8 = val;
                  if (-1 < val) {
                    if ((uint)val < 0x10000) goto LAB_0010dbde;
LAB_0010dc21:
                    pcVar7 = "[SAVETAP] Values more than FFFFh are not allowed";
                  }
                }
              }
              else {
LAB_0010daa0:
                pcVar7 = "[SAVETAP] Values higher than FFFFh are not allowed";
              }
            }
          }
        }
      }
    }
LAB_0010db44:
    Error(pcVar7,bp,local_a4);
  }
  else {
    if (StartAddress < 0) goto LAB_0010d7c8;
    start = StartAddress;
    if (pcVar1 == (char *)0x0) goto LAB_0010db5a;
LAB_0010d7a4:
    bVar2 = IsZXSpectrumDevice(DeviceID);
    if (bVar2) {
      iVar4 = TAP_SaveSnapshot(&fnaam,(unsigned_short)start);
LAB_0010d7be:
      if (iVar4 != 0) goto LAB_0010db5a;
    }
    else {
      Error("[SAVETAP snapshot] Device is not of ZX Spectrum type.",Device->ID,SUPPRESS);
    }
    Error("[SAVETAP] Error writing file",bp,IF_FIRST);
  }
LAB_0010db5a:
  std::__cxx11::string::~string((string *)&fnaamh);
  std::filesystem::__cxx11::path::~path(&fnaam);
  return;
}

Assistant:

static void dirSAVETAP() {
	if (pass != LASTPASS) {
		SkipParam(lp);
		return;
	}

	bool exec = true, realtapeMode = false;
	int headerType = -1;
	aint val;
	int start = -1, length = -1, param2 = -1, param3 = -1;

	if (!DeviceID) {
		Error("SAVETAP only allowed in real device emulation mode (See DEVICE)");
		exec = false;
	}

	const std::filesystem::path fnaam = GetOutputFileName(lp);
	std::string fnaamh {""};
	if (anyComma(lp)) {
		if (!anyComma(lp)) {
			char *tlp = lp;
			char *id;

			if ((id = GetID(lp)) && strlen(id) > 0) {
				if (cmphstr(id, "basic")) {
					headerType = BASIC;
					realtapeMode = true;
				} else if (cmphstr(id, "numbers")) {
					headerType = NUMBERS;
					realtapeMode = true;
				} else if (cmphstr(id, "chars")) {
					headerType = CHARS;
					realtapeMode = true;
				} else if (cmphstr(id, "code")) {
					headerType = CODE;
					realtapeMode = true;
				} else if (cmphstr(id, "headless")) {
					headerType = HEADLESS;
					realtapeMode = true;
				}
			}

			if (realtapeMode) {
				if (anyComma(lp)) {
					if (headerType == HEADLESS) {
						if (!anyComma(lp)) {
							if (!ParseExpression(lp, val)) {
								Error("[SAVETAP] Syntax error", bp, PASS3); return;
							}
							if (val < 0) {
								Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
							} else if (val > 0xFFFF) {
								Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
							}
							start = val;
						} else {
							Error("[SAVETAP] Syntax error. Missing start address", bp, PASS3); return;
						}
						if (anyComma(lp)) {
							if (!ParseExpression(lp, val)) {
								Error("[SAVETAP] Syntax error", bp, PASS3); return;
							}
							if (val < 0) {
								Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
							} else if (val > 0xFFFF) {
								Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
							}
							length = val;
						}
						if (anyComma(lp)) {
							if (!ParseExpression(lp, val)) {
								Error("[SAVETAP] Syntax error", bp, PASS3); return;
							}
							if (val < 0 || val > 255) {
								Error("[SAVETAP] Invalid flag byte", bp, PASS3); return;
							}
							param3 = val;
						}
					} else if (!anyComma(lp)) {
						fnaamh = GetDelimitedString(lp);
						if (fnaamh.empty()) {
							Error("[SAVETAP] Syntax error in tape file name", bp, PASS3);
							return;
						} else if (anyComma(lp) && !anyComma(lp) && ParseExpression(lp, val)) {
							if (val < 0) {
								Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
							} else if (val > 0xFFFF) {
								Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
							}
							start = val;

							if (anyComma(lp) && !anyComma(lp) && ParseExpression(lp, val)) {
								if (val < 0) {
									Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
								} else if (val > 0xFFFF) {
									Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
								}
								length = val;

								if (anyComma(lp)) {
									if (!ParseExpression(lp, val)) {
										Error("[SAVETAP] Syntax error", bp, IF_FIRST); return;
									}
									if (val < 0) {
										Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
									} else if (val > 0xFFFF) {
										Error("[SAVETAP] Values more than FFFFh are not allowed", bp, PASS3); return;
									}
									param2 = val;
								}
								if (anyComma(lp)) {
									if (!ParseExpression(lp, val)) {
										Error("[SAVETAP] Syntax error", bp, IF_FIRST); return;
									}
									if (val < 0) {
										Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
									} else if (val > 0xFFFF) {
										Error("[SAVETAP] Values more than FFFFh are not allowed", bp, PASS3); return;
									}
									param3 = val;
								}
							} else {
								Error("[SAVETAP] Syntax error. Missing block length", bp, PASS3); return;
							}
						} else {
							Error("[SAVETAP] Syntax error. Missing start address", bp, PASS3); return;
						}
					} else {
						Error("[SAVETAP] Syntax error. Missing tape block file name", bp, PASS3); return;
					}
				} else {
					realtapeMode = false;
				}
			}
			if (!realtapeMode) {
				lp = tlp;
				IsLabelNotFound = false;
				if (!ParseExpression(lp, val) || IsLabelNotFound) {
					Error("[SAVETAP] Syntax error", bp, PASS3); return;
				}
				if (val < 0) {
					Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
				}
				start = val;
			}
		} else {
			Error("[SAVETAP] Syntax error. No parameters", bp, PASS3); return;
		}
	} else if (StartAddress < 0) {
		Error("[SAVETAP] Syntax error. No parameters", bp, PASS3); return;
	} else {
		start = StartAddress;
	}

	if (exec) {
		int done = 0;

		if (realtapeMode) {
			done = TAP_SaveBlock(fnaam, headerType, fnaamh.c_str(), start, length, param2, param3);
		} else {
			if (!IsZXSpectrumDevice(DeviceID)) {
				Error("[SAVETAP snapshot] Device is not of ZX Spectrum type.", Device->ID, SUPPRESS);
			} else {
				done = TAP_SaveSnapshot(fnaam, start);
			}
		}

		if (!done) {
			Error("[SAVETAP] Error writing file", bp, IF_FIRST);
		}
	}
}